

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DMDetector.cpp
# Opt level: O2

bool __thiscall
ZXing::DataMatrix::EdgeTracer::traceGaps
          (EdgeTracer *this,PointF dEdge,RegressionLine *line,int maxStepSize,
          RegressionLine *finishLine,double minDist)

{
  PointT<double> *pPVar1;
  pointer *ppPVar2;
  double dVar3;
  double dVar4;
  PointF p;
  pointer pPVar5;
  ByteMatrix *pBVar6;
  pointer pcVar7;
  undefined1 auVar8 [12];
  PointF p_00;
  PointF p_01;
  PointF p_02;
  PointF p_03;
  PointF p_04;
  PointF p_05;
  bool bVar9;
  uint uVar10;
  int iVar11;
  uint uVar12;
  int iVar13;
  int iVar14;
  int iVar15;
  int iVar16;
  int iVar17;
  ulong uVar18;
  double dVar19;
  double dVar20;
  double dVar21;
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  PointT<double> PVar25;
  undefined1 auVar26 [16];
  undefined1 auVar28 [16];
  double dVar29;
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  PointF PVar32;
  PointT<double> pos;
  PointT<double> p_06;
  PointT<double> pos_00;
  PointT<double> pos_01;
  int local_ac;
  PointF local_a8;
  double local_48;
  double dStack_40;
  undefined1 auVar27 [16];
  
  dVar29 = dEdge.y;
  dVar19 = dEdge.x;
  auVar30._8_8_ = 0;
  auVar30._0_8_ = dVar19;
  auVar23._8_8_ = 0;
  auVar23._0_8_ = dVar29;
  auVar24._0_8_ = SQRT(dVar19 * dVar19 + dVar29 * dVar29);
  auVar24._8_8_ = auVar24._0_8_;
  PVar32 = (PointF)divpd((undefined1  [16])dEdge,auVar24);
  line->_directionInward = PVar32;
  uVar10 = (uint)(ABS(dVar29) < ABS(dVar19));
  auVar22._0_4_ = (int)(uVar10 << 0x1f) >> 0x1f;
  auVar22._4_4_ = (int)(uVar10 << 0x1f) >> 0x1f;
  auVar22._8_4_ = (int)(uVar10 << 0x1f) >> 0x1f;
  auVar22._12_4_ = (int)(uVar10 << 0x1f) >> 0x1f;
  auVar23 = ~auVar22 & auVar23 << 0x40 | auVar30 & auVar22;
  iVar14 = 0;
  local_ac = 0;
  dVar19 = 0.0;
  dVar29 = 0.0;
  iVar15 = maxStepSize;
  do {
    pPVar1 = &(this->super_BitMatrixCursorF).p;
    dVar3 = pPVar1->x;
    dVar4 = (this->super_BitMatrixCursorF).p.y;
    PVar32.x = pPVar1->x;
    PVar32.y = pPVar1->y;
    if ((dVar3 == dVar19) && (!NAN(dVar3) && !NAN(dVar19))) {
      if ((dVar4 == dVar29) && (!NAN(dVar4) && !NAN(dVar29))) {
        return false;
      }
    }
    iVar11 = local_ac + 1;
    iVar16 = iVar11;
    if (local_ac == 0) {
      iVar16 = 2;
    }
    if (iVar16 * maxStepSize < iVar14) {
      return false;
    }
    dVar19 = line->a;
    if (!NAN(dVar19)) {
      dVar19 = RegressionLine::signedDistance(line,PVar32);
      if (dVar19 < -5.0) {
        bVar9 = RegressionLine::evaluate(line,-1.0,false);
        if (!bVar9) {
          return false;
        }
        p_00.x = (this->super_BitMatrixCursorF).p.x;
        p_00.y = (this->super_BitMatrixCursorF).p.y;
        dVar19 = RegressionLine::signedDistance(line,p_00);
        if (dVar19 < -5.0) {
          return false;
        }
      }
      dVar19 = line->a;
    }
    if ((NAN(dVar19)) ||
       (p_01.x = (this->super_BitMatrixCursorF).p.x, p_01.y = (this->super_BitMatrixCursorF).p.y,
       dVar19 = RegressionLine::signedDistance(line,p_01), dVar19 <= 3.0)) {
      pPVar5 = (line->_points).
               super__Vector_base<ZXing::PointT<double>,_std::allocator<ZXing::PointT<double>_>_>.
               _M_impl.super__Vector_impl_data._M_finish;
      if ((line->_points).
          super__Vector_base<ZXing::PointT<double>,_std::allocator<ZXing::PointT<double>_>_>._M_impl
          .super__Vector_impl_data._M_start == pPVar5) {
        p_03.x = (this->super_BitMatrixCursorF).p.x;
        p_03.y = (this->super_BitMatrixCursorF).p.y;
        RegressionLine::add(line,p_03);
        auVar26 = (undefined1  [16])0x0;
LAB_0016840b:
        dVar19 = SUB168(auVar26 & _DAT_0019b270,8);
        dVar29 = SUB168(auVar26 & _DAT_0019b270,0);
        if (dVar19 <= dVar29) {
          dVar19 = dVar29;
        }
        if (dVar19 < 2.0) {
          iVar11 = local_ac;
          if ((local_ac == 0) &&
             (local_ac = 0, iVar11 = local_ac,
             iVar15 * 2 <=
             (int)((ulong)((long)(line->_points).
                                 super__Vector_base<ZXing::PointT<double>,_std::allocator<ZXing::PointT<double>_>_>
                                 ._M_impl.super__Vector_impl_data._M_finish -
                          (long)(line->_points).
                                super__Vector_base<ZXing::PointT<double>,_std::allocator<ZXing::PointT<double>_>_>
                                ._M_impl.super__Vector_impl_data._M_start) >> 4))) {
            return false;
          }
          goto LAB_001684dd;
        }
      }
      else {
        dVar19 = (this->super_BitMatrixCursorF).d.x;
        dVar29 = (this->super_BitMatrixCursorF).d.y;
        dVar20 = ABS(dVar19);
        dVar21 = ABS(dVar29);
        if (dVar20 <= dVar21) {
          dVar19 = 0.0;
        }
        PVar25 = pPVar5[-1];
        p.x = (this->super_BitMatrixCursorF).p.x;
        p.y = (this->super_BitMatrixCursorF).p.y;
        auVar26._0_8_ = p.x - PVar25.x;
        auVar26._8_8_ = p.y - PVar25.y;
        RegressionLine::add(line,p);
        if (dVar19 * auVar26._0_8_ +
            auVar26._8_8_ * (double)(~-(ulong)(dVar21 < dVar20) & (ulong)dVar29) <= 1.0)
        goto LAB_0016840b;
      }
      if ((0 < local_ac) ||
         (0x50 < (ulong)((long)(line->_points).
                               super__Vector_base<ZXing::PointT<double>,_std::allocator<ZXing::PointT<double>_>_>
                               ._M_impl.super__Vector_impl_data._M_finish -
                        (long)(line->_points).
                              super__Vector_base<ZXing::PointT<double>,_std::allocator<ZXing::PointT<double>_>_>
                              ._M_impl.super__Vector_impl_data._M_start))) {
        bVar9 = updateDirectionFromLine(this,line);
        if (!bVar9) {
          return false;
        }
        if ((2 < local_ac && minDist != 0.0) &&
           (pPVar5 = (line->_points).
                     super__Vector_base<ZXing::PointT<double>,_std::allocator<ZXing::PointT<double>_>_>
                     ._M_impl.super__Vector_impl_data._M_start,
           dVar19 = (this->super_BitMatrixCursorF).p.x - pPVar5->x,
           dVar29 = (this->super_BitMatrixCursorF).p.y - pPVar5->y,
           minDist < SQRT(dVar19 * dVar19 + dVar29 * dVar29))) {
          ppPVar2 = &(line->_points).
                     super__Vector_base<ZXing::PointT<double>,_std::allocator<ZXing::PointT<double>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish;
          *ppPVar2 = *ppPVar2 + -1;
          return true;
        }
      }
    }
    else {
      dVar19 = (this->super_BitMatrixCursorF).d.x;
      dVar29 = (this->super_BitMatrixCursorF).d.y;
      dVar20 = SQRT(dVar19 * dVar19 + dVar29 * dVar29);
      PVar32 = RegressionLine::normal(line);
      if (0.7 < ABS(PVar32.x * (dVar19 / dVar20) + PVar32.y * (dVar29 / dVar20))) {
        return false;
      }
      bVar9 = RegressionLine::evaluate(line,1.5,false);
      if (!bVar9) {
        return false;
      }
      p_02.x = (this->super_BitMatrixCursorF).p.x;
      p_02.y = (this->super_BitMatrixCursorF).p.y;
      local_a8 = RegressionLine::project(line,p_02);
      while( true ) {
        PVar32 = RegressionLine::project
                           (line,(line->_points).
                                 super__Vector_base<ZXing::PointT<double>,_std::allocator<ZXing::PointT<double>_>_>
                                 ._M_impl.super__Vector_impl_data._M_finish[-1]);
        dVar29 = local_a8.x - PVar32.x;
        dVar19 = local_a8.y - PVar32.y;
        if (1.0 <= SQRT(dVar29 * dVar29 + dVar19 * dVar19)) break;
        local_a8.y = local_a8.y + (this->super_BitMatrixCursorF).d.y;
        local_a8.x = local_a8.x + (this->super_BitMatrixCursorF).d.x;
      }
      dVar19 = floor(local_a8.x);
      dVar29 = floor(local_a8.y);
      PVar25.x = dVar19 + 0.5;
      PVar25.y = dVar29 + 0.5;
      (this->super_BitMatrixCursorF).p = PVar25;
      iVar11 = local_ac;
    }
LAB_001684dd:
    local_ac = iVar11;
    iVar16 = iVar15;
    if (!NAN(finishLine->a)) {
      p_04.x = (this->super_BitMatrixCursorF).p.x;
      p_04.y = (this->super_BitMatrixCursorF).p.y;
      dVar19 = RegressionLine::signedDistance(finishLine,p_04);
      iVar16 = (int)dVar19;
      if (iVar15 < (int)dVar19) {
        iVar16 = iVar15;
      }
    }
    iVar15 = iVar16;
    iVar14 = iVar14 + 1;
    iVar16 = 0;
    if (0 < iVar15) {
      iVar16 = iVar15;
    }
    iVar11 = NAN(line->a) + 2 + (uint)NAN(line->a);
    if (iVar15 == 1) {
      iVar11 = 3;
    }
    iVar13 = 1;
LAB_00168540:
    if (iVar13 == iVar11) {
      if (NAN(finishLine->a)) {
        return false;
      }
      p_05.x = (this->super_BitMatrixCursorF).p.x;
      p_05.y = (this->super_BitMatrixCursorF).p.y;
      dVar19 = RegressionLine::signedDistance(finishLine,p_05);
      return (int)dVar19 <= iVar15 + 1;
    }
    uVar18 = 1;
LAB_00168550:
    iVar17 = (int)uVar18;
    if (iVar17 == iVar16 + 1) goto LAB_001685f5;
    uVar10 = 0;
    do {
      if (((int)(uVar18 >> 2) * 2 + 2) * iVar13 + 1U == uVar10) goto LAB_001685e5;
      uVar12 = -(uVar10 >> 1);
      if ((uVar10 & 1) != 0) {
        uVar12 = uVar10 + 1 >> 1;
      }
      local_48 = auVar23._0_8_;
      dStack_40 = auVar23._8_8_;
      local_a8.x = (double)(int)uVar12 * local_48 +
                   (this->super_BitMatrixCursorF).d.x * (double)iVar17 +
                   (this->super_BitMatrixCursorF).p.x;
      local_a8.y = (double)(int)uVar12 * dStack_40 +
                   (this->super_BitMatrixCursorF).d.y * (double)iVar17 +
                   (this->super_BitMatrixCursorF).p.y;
      pos.x = local_48 + local_a8.x;
      dVar19 = dStack_40 + local_a8.y;
      pos.y = dVar19;
      auVar27._8_8_ = dVar19;
      auVar27._0_8_ = (ulong)dVar19;
      bVar9 = BitMatrixCursor<ZXing::PointT<double>_>::blackAt(&this->super_BitMatrixCursorF,pos);
      uVar10 = uVar10 + 1;
    } while (!bVar9);
    iVar16 = 3;
    if (3 < iVar15) {
      iVar16 = iVar15;
    }
    while( true ) {
      if (iVar16 == 0) {
        return false;
      }
      auVar8._4_8_ = auVar27._8_8_;
      auVar8._0_4_ = local_a8.x._4_4_;
      auVar28._0_8_ = auVar8._0_8_ << 0x20;
      auVar28._8_4_ = local_a8.y._0_4_;
      auVar28._12_4_ = local_a8.y._4_4_;
      dVar19 = auVar28._8_8_;
      p_06.x = local_a8.x;
      p_06.y = dVar19;
      bVar9 = BitMatrixCursor<ZXing::PointT<double>_>::isIn(&this->super_BitMatrixCursorF,p_06);
      if (!bVar9) {
        return false;
      }
      pos_00.y = dVar19;
      pos_00.x = p_06.x;
      bVar9 = BitMatrixCursor<ZXing::PointT<double>_>::whiteAt(&this->super_BitMatrixCursorF,pos_00)
      ;
      if (bVar9) break;
      dVar19 = p_06.x - local_48;
      local_a8.y = local_a8.y - dStack_40;
      local_a8.x = dVar19;
      pos_01.x = dVar19 - (this->super_BitMatrixCursorF).d.x;
      pos_01.y = local_a8.y - (this->super_BitMatrixCursorF).d.y;
      bVar9 = BitMatrixCursor<ZXing::PointT<double>_>::blackAt(&this->super_BitMatrixCursorF,pos_01)
      ;
      uVar10 = (uint)bVar9;
      auVar27._0_8_ = CONCAT44((int)(uVar10 << 0x1f) >> 0x1f,(int)(uVar10 << 0x1f) >> 0x1f);
      auVar27._8_4_ = (int)(uVar10 << 0x1f) >> 0x1f;
      auVar27._12_4_ = (int)(uVar10 << 0x1f) >> 0x1f;
      auVar31._0_8_ = (ulong)(dVar19 - (this->super_BitMatrixCursorF).d.x) & auVar27._0_8_;
      auVar31._8_8_ = (ulong)(local_a8.y - (this->super_BitMatrixCursorF).d.y) & auVar27._8_8_;
      local_a8 = (PointF)(auVar31 | ~auVar27 & (undefined1  [16])local_a8);
      iVar16 = iVar16 + -1;
    }
    dVar20 = floor(p_06.x);
    dVar21 = floor(dVar19);
    (this->super_BitMatrixCursorF).p.x = dVar20 + 0.5;
    (this->super_BitMatrixCursorF).p.y = dVar21 + 0.5;
    pBVar6 = this->history;
    dVar19 = dVar3;
    dVar29 = dVar4;
    if (pBVar6 != (ByteMatrix *)0x0 && iVar15 == 1) {
      iVar16 = (int)(dVar21 + 0.5) * (pBVar6->super_Matrix<signed_char>)._width +
               (int)(dVar20 + 0.5);
      pcVar7 = (pBVar6->super_Matrix<signed_char>)._data.
               super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
               super__Vector_impl_data._M_start;
      if (this->state == (int)pcVar7[iVar16]) {
        return false;
      }
      pcVar7[iVar16] = (char)this->state;
    }
  } while( true );
LAB_001685e5:
  uVar18 = (ulong)(iVar17 + 1);
  goto LAB_00168550;
LAB_001685f5:
  iVar13 = iVar13 + 1;
  goto LAB_00168540;
}

Assistant:

bool traceGaps(PointF dEdge, RegressionLine& line, int maxStepSize, const RegressionLine& finishLine = {}, double minDist = 0)
	{
		line.setDirectionInward(dEdge);
		int gaps = 0, steps = 0, maxStepsPerGap = maxStepSize;
		PointF lastP;
		do {
			// detect an endless loop (lack of progress). if encountered, please report.
			// this fixes a deadlock in falsepositives-1/#570.png and the regression in #574
			if (p == std::exchange(lastP, p) || steps++ > (gaps == 0 ? 2 : gaps + 1) * maxStepsPerGap)
				return false;
			log(p);

			// if we drifted too far outside of the code, break
			if (line.isValid() && line.signedDistance(p) < -5 && (!line.evaluate() || line.signedDistance(p) < -5))
				return false;

			// if we are drifting towards the inside of the code, pull the current position back out onto the line
			if (line.isValid() && line.signedDistance(p) > 3) {
				// The current direction d and the line we are tracing are supposed to be roughly parallel.
				// In case the 'go outward' step in traceStep lead us astray, we might end up with a line
				// that is almost perpendicular to d. Then the back-projection below can result in an
				// endless loop. Break if the angle between d and line is greater than 45 deg.
				if (std::abs(dot(normalized(d), line.normal())) > 0.7) // thresh is approx. sin(45 deg)
					return false;

				// re-evaluate line with all the points up to here before projecting
				if (!line.evaluate(1.5))
					return false;

				auto np = line.project(p);
				// make sure we are making progress even when back-projecting:
				// consider a 90deg corner, rotated 45deg. we step away perpendicular from the line and get
				// back projected where we left off the line.
				// The 'while' instead of 'if' was introduced to fix the issue with #245. It turns out that
				// np can actually be behind the projection of the last line point and we need 2 steps in d
				// to prevent a dead lock. see #245.png
				while (distance(np, line.project(line.points().back())) < 1)
					np = np + d;
				p = centered(np);
			}
			else {
				auto curStep = line.points().empty() ? PointF() : p - line.points().back();
				auto stepLengthInMainDir = line.points().empty() ? 0.0 : dot(mainDirection(d), curStep);
				line.add(p);

				if (stepLengthInMainDir > 1 || maxAbsComponent(curStep) >= 2) {
					++gaps;
					if (gaps >= 2 || line.points().size() > 5) {
						if (!updateDirectionFromLine(line))
							return false;
						// check if the first half of the top-line trace is complete.
						// the minimum code size is 10x10 -> every code has at least 4 gaps
						if (minDist && gaps >= 4 && distance(p, line.points().front()) > minDist) {
							// undo the last insert, it will be inserted again after the restart
							line.pop_back();
							--gaps;
							return true;
						}
					}
				} else if (gaps == 0 && Size(line.points()) >= 2 * maxStepSize) {
					return false; // no point in following a line that has no gaps
				}
			}

			if (finishLine.isValid())
				UpdateMin(maxStepSize, static_cast<int>(finishLine.signedDistance(p)));

			auto stepResult = traceStep(dEdge, maxStepSize, line.isValid());

			if (stepResult != StepResult::FOUND)
				// we are successful iff we found an open end across a valid finishLine
				return stepResult == StepResult::OPEN_END && finishLine.isValid() &&
					   static_cast<int>(finishLine.signedDistance(p)) <= maxStepSize + 1;
		} while (true);
	}